

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O0

void data_sheet_expat_callback_find_cell_end(void *callbackdata,XML_Char *name)

{
  int iVar1;
  size_t index;
  XML_Char *__s;
  char *pcVar2;
  char *local_48;
  ulong local_40;
  size_t col;
  XML_Char *s;
  long num;
  XML_Char *p;
  data_sheet_callback_data *data;
  XML_Char *name_local;
  void *callbackdata_local;
  
  p = (XML_Char *)callbackdata;
  data = (data_sheet_callback_data *)name;
  name_local = (XML_Char *)callbackdata;
  iVar1 = XML_Char_icmp_ins(name,"c");
  if (iVar1 == 0) {
    if (*(long *)(p + 0x30) != 0) {
      *(undefined1 *)(*(long *)(p + 0x30) + *(long *)(p + 0x38)) = 0;
      if (*(int *)(p + 0x40) == 3) {
        num = 0;
        index = strtol(*(char **)(p + 0x30),(char **)&num,10);
        if ((num == 0) || ((num != *(long *)(p + 0x30) && (*(char *)num == '\0')))) {
          __s = sharedstringlist_get(*(sharedstringlist **)(p + 8),index);
          free(*(void **)(p + 0x30));
          if (__s == (XML_Char *)0x0) {
            local_48 = (char *)0x0;
          }
          else {
            local_48 = strdup(__s);
          }
          *(char **)(p + 0x30) = local_48;
        }
      }
      else if (*(int *)(p + 0x40) == 0) {
        free(*(void **)(p + 0x30));
        p[0x30] = '\0';
        p[0x31] = '\0';
        p[0x32] = '\0';
        p[0x33] = '\0';
        p[0x34] = '\0';
        p[0x35] = '\0';
        p[0x36] = '\0';
        p[0x37] = '\0';
      }
    }
    *(long *)(p + 0x18) = *(long *)(p + 0x18) + 1;
    p[0x40] = '\0';
    p[0x41] = '\0';
    p[0x42] = '\0';
    p[0x43] = '\0';
    p[0x38] = '\0';
    p[0x39] = '\0';
    p[0x3a] = '\0';
    p[0x3b] = '\0';
    p[0x3c] = '\0';
    p[0x3d] = '\0';
    p[0x3e] = '\0';
    p[0x3f] = '\0';
    XML_SetElementHandler
              (*(undefined8 *)p,data_sheet_expat_callback_find_cell_start,
               data_sheet_expat_callback_find_row_end);
    XML_SetCharacterDataHandler(*(undefined8 *)p,0);
    if (((*(long *)(p + 0x30) != 0) ||
        (((*(uint *)(p + 0x44) & 2) == 0 &&
         (((*(uint *)(p + 0x44) & 1) == 0 || (*(long *)(p + 0x28) != 0)))))) &&
       (((*(uint *)(p + 0x44) & 4) == 0 ||
        ((*(long *)(p + 0x20) == 0 || (*(ulong *)(p + 0x18) <= *(ulong *)(p + 0x20))))))) {
      if ((*(uint *)(p + 0x44) & 0x80) == 0) {
        if (*(long *)(p + 0x78) != 0) {
          if ((((*(uint *)(p + 0x44) & 2) == 0) && (*(long *)(p + 0x28) == 0)) &&
             (1 < *(ulong *)(p + 0x18))) {
            for (local_40 = 1; local_40 < *(ulong *)(p + 0x18); local_40 = local_40 + 1) {
              iVar1 = (**(code **)(p + 0x78))
                                (*(undefined8 *)(p + 0x10),local_40,0,*(undefined8 *)(p + 0x80));
              if (iVar1 != 0) {
                XML_StopParser(*(undefined8 *)p,0);
                return;
              }
            }
          }
          iVar1 = (**(code **)(p + 0x78))
                            (*(undefined8 *)(p + 0x10),*(undefined8 *)(p + 0x18),
                             *(undefined8 *)(p + 0x30),*(undefined8 *)(p + 0x80));
          if (iVar1 == 0) {
            *(long *)(p + 0x28) = *(long *)(p + 0x28) + 1;
          }
          else {
            XML_StopParser(*(undefined8 *)p,0);
          }
        }
      }
      else {
        if (*(long *)(p + 0x30) == 0) {
          pcVar2 = strdup("");
          *(char **)(p + 0x30) = pcVar2;
        }
        XML_StopParser(*(undefined8 *)p,1);
        *(long *)(p + 0x28) = *(long *)(p + 0x28) + 1;
      }
    }
  }
  else {
    data_sheet_expat_callback_find_row_end(name_local,(XML_Char *)data);
  }
  return;
}

Assistant:

void data_sheet_expat_callback_find_cell_end (void* callbackdata, const XML_Char* name)
{
  struct data_sheet_callback_data* data = (struct data_sheet_callback_data*)callbackdata;
  if (XML_Char_icmp_ins(name, X("c")) == 0) {
    //determine value
    if (data->celldata) {
      data->celldata[data->celldatalen] = 0;
      if (data->cell_string_type == shared_string) {
        //get shared string
        XML_Char* p = NULL;
        long num = XML_Char_strtol(data->celldata, &p, 10);
        if (!p || (p != data->celldata && *p == 0)) {
          const XML_Char* s = sharedstringlist_get(data->sharedstrings, num);
          free(data->celldata);
          data->celldata = (s ? XML_Char_dup(s) : NULL);
        }
      } else if (data->cell_string_type == none) {
        //unknown value type
        free(data->celldata);
        data->celldata = NULL;
      }
    }
    //reset data
    data->colnr++;
    data->cell_string_type = none;
    data->celldatalen = 0;
    XML_SetElementHandler(data->xmlparser, data_sheet_expat_callback_find_cell_start, data_sheet_expat_callback_find_row_end);
    XML_SetCharacterDataHandler(data->xmlparser, NULL);
    //process data if needed
    if (data->celldata || !((data->flags & XLSXIOREAD_SKIP_EMPTY_CELLS) || ((data->flags & XLSXIOREAD_SKIP_EMPTY_ROWS) && data->colsnotnull == 0))) {
      if (!((data->flags & XLSXIOREAD_SKIP_EXTRA_CELLS) && data->cols > 0 && data->colnr > data->cols)) {
        //process data
        if (!(data->flags & XLSXIOREAD_NO_CALLBACK)) {
          if (data->sheet_cell_callback) {
            //insert empty columns if needed in case of empty row detection
            /////if ((data->flags & XLSXIOREAD_SKIP_EMPTY_ROWS) && !(data->flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && data->colsnotnull == 0 && data->colnr > 1) {
            if (!(data->flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && data->colsnotnull == 0 && data->colnr > 1) {
              size_t col;
              for (col = 1; col < data->colnr; col++) {
                if ((*data->sheet_cell_callback)(data->rownr, col, NULL, data->callbackdata)) {
                  XML_StopParser(data->xmlparser, XML_FALSE);
                  return;
                }
              }
            }
            //process current column data
            if ((*data->sheet_cell_callback)(data->rownr, data->colnr, data->celldata, data->callbackdata)) {
              XML_StopParser(data->xmlparser, XML_FALSE);
              return;
            }
            data->colsnotnull++;
          }
        } else {
          //for non-calback method suspend here with cell data (don't return NULL as that is used to indicate end of row)
          if (!data->celldata)
            data->celldata = XML_Char_dup(X(""));
          XML_StopParser(data->xmlparser, XML_TRUE);
          data->colsnotnull++;
        }
      }
    }
  } else {
    data_sheet_expat_callback_find_row_end(callbackdata, name);
  }
}